

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O2

UnicodeString * __thiscall
icu_63::Normalizer2WithImpl::normalize
          (Normalizer2WithImpl *this,UnicodeString *src,UnicodeString *dest,UErrorCode *errorCode)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  char16_t *pcVar5;
  uint uVar6;
  ReorderingBuffer buffer;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar5 = UnicodeString::getBuffer(src);
    if (dest != src && pcVar5 != (char16_t *)0x0) {
      uVar1 = (dest->fUnion).fStackFields.fLengthAndFlags;
      uVar3 = 2;
      if ((uVar1 & 1) == 0) {
        uVar3 = uVar1 & 0x1e;
      }
      (dest->fUnion).fStackFields.fLengthAndFlags = uVar3;
      buffer.impl = this->impl;
      buffer.start = (UChar *)0x0;
      buffer.reorderStart._0_5_ = 0;
      buffer.reorderStart._5_3_ = 0;
      buffer.limit._0_5_ = 0;
      buffer._37_8_ = 0;
      sVar2 = (src->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        uVar6 = (src->fUnion).fFields.fLength;
      }
      else {
        uVar6 = (int)sVar2 >> 5;
      }
      buffer.str = dest;
      iVar4 = ReorderingBuffer::init(&buffer,(EVP_PKEY_CTX *)(ulong)uVar6);
      if ((char)iVar4 != '\0') {
        sVar2 = (src->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar4 = (src->fUnion).fFields.fLength;
        }
        else {
          iVar4 = (int)sVar2 >> 5;
        }
        (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x12])
                  (this,pcVar5,pcVar5 + iVar4,&buffer,errorCode);
      }
      ReorderingBuffer::~ReorderingBuffer(&buffer);
      return dest;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  UnicodeString::setToBogus(dest);
  return dest;
}

Assistant:

virtual UnicodeString &
    normalize(const UnicodeString &src,
              UnicodeString &dest,
              UErrorCode &errorCode) const {
        if(U_FAILURE(errorCode)) {
            dest.setToBogus();
            return dest;
        }
        const UChar *sArray=src.getBuffer();
        if(&dest==&src || sArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            dest.setToBogus();
            return dest;
        }
        dest.remove();
        ReorderingBuffer buffer(impl, dest);
        if(buffer.init(src.length(), errorCode)) {
            normalize(sArray, sArray+src.length(), buffer, errorCode);
        }
        return dest;
    }